

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O0

bool __thiscall DListMenu::MenuEvent(DListMenu *this,int mkey,bool fromcontroller)

{
  uint uVar1;
  FListMenuItem **ppFVar2;
  int iVar3;
  bool bVar4;
  float fVar5;
  FSoundID local_34;
  FSoundID local_30;
  FSoundID local_2c;
  int local_28;
  int local_24;
  int startedAt;
  int oldSelect;
  bool fromcontroller_local;
  DListMenu *pDStack_18;
  int mkey_local;
  DListMenu *this_local;
  
  local_24 = this->mDesc->mSelectedItem;
  local_28 = this->mDesc->mSelectedItem;
  if (local_28 < 0) {
    local_28 = 0;
  }
  startedAt._3_1_ = fromcontroller;
  pDStack_18 = this;
  if (mkey == 0) {
    oldSelect = 0;
    do {
      iVar3 = this->mDesc->mSelectedItem + -1;
      this->mDesc->mSelectedItem = iVar3;
      if (iVar3 < 0) {
        uVar1 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                          (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>);
        this->mDesc->mSelectedItem = uVar1 - 1;
      }
      ppFVar2 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                          (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                           (long)this->mDesc->mSelectedItem);
      uVar1 = (*(*ppFVar2)->_vptr_FListMenuItem[5])();
      bVar4 = false;
      if ((uVar1 & 1) == 0) {
        bVar4 = this->mDesc->mSelectedItem != local_28;
      }
    } while (bVar4);
    if (this->mDesc->mSelectedItem == local_28) {
      this->mDesc->mSelectedItem = local_24;
    }
    FSoundID::FSoundID(&local_2c,"menu/cursor");
    fVar5 = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,&local_2c,fVar5,0.0);
    this_local._7_1_ = true;
  }
  else if (mkey == 1) {
    oldSelect = 1;
    do {
      iVar3 = this->mDesc->mSelectedItem + 1;
      this->mDesc->mSelectedItem = iVar3;
      uVar1 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                        (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>);
      if ((int)uVar1 <= iVar3) {
        this->mDesc->mSelectedItem = 0;
      }
      ppFVar2 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                          (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                           (long)this->mDesc->mSelectedItem);
      uVar1 = (*(*ppFVar2)->_vptr_FListMenuItem[5])();
      bVar4 = false;
      if ((uVar1 & 1) == 0) {
        bVar4 = this->mDesc->mSelectedItem != local_28;
      }
    } while (bVar4);
    if (this->mDesc->mSelectedItem == local_28) {
      this->mDesc->mSelectedItem = local_24;
    }
    FSoundID::FSoundID(&local_30,"menu/cursor");
    fVar5 = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,&local_30,fVar5,0.0);
    this_local._7_1_ = true;
  }
  else {
    oldSelect = mkey;
    if (mkey == 6) {
      if (-1 < this->mDesc->mSelectedItem) {
        ppFVar2 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                            (&(this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>,
                             (long)this->mDesc->mSelectedItem);
        uVar1 = (*(*ppFVar2)->_vptr_FListMenuItem[6])();
        if ((uVar1 & 1) != 0) {
          FSoundID::FSoundID(&local_34,"menu/choose");
          fVar5 = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
          S_Sound(0x22,&local_34,fVar5,0.0);
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = DMenu::MenuEvent(&this->super_DMenu,mkey,fromcontroller);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DListMenu::MenuEvent (int mkey, bool fromcontroller)
{
	int oldSelect = mDesc->mSelectedItem;
	int startedAt = mDesc->mSelectedItem;
	if (startedAt < 0) startedAt = 0;

	switch (mkey)
	{
	case MKEY_Up:
		do
		{
			if (--mDesc->mSelectedItem < 0) mDesc->mSelectedItem = mDesc->mItems.Size()-1;
		}
		while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable() && mDesc->mSelectedItem != startedAt);
		if (mDesc->mSelectedItem == startedAt) mDesc->mSelectedItem = oldSelect;
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
		return true;

	case MKEY_Down:
		do
		{
			if (++mDesc->mSelectedItem >= (int)mDesc->mItems.Size()) mDesc->mSelectedItem = 0;
		}
		while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable() && mDesc->mSelectedItem != startedAt);
		if (mDesc->mSelectedItem == startedAt) mDesc->mSelectedItem = oldSelect;
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
		return true;

	case MKEY_Enter:
		if (mDesc->mSelectedItem >= 0 && mDesc->mItems[mDesc->mSelectedItem]->Activate())
		{
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
		}
		return true;

	default:
		return Super::MenuEvent(mkey, fromcontroller);
	}
}